

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O0

int reconstructSeeds(tree_t *tree,uint16_t *hideList,size_t hideListSize,uint8_t *input,
                    size_t inputLen,uint8_t *salt,uint repIndex,picnic_instance_t *params)

{
  uint *__ptr;
  size_t *in_RDX;
  size_t in_RSI;
  uint16_t *in_RDI;
  tree_t *unaff_retaddr;
  size_t i;
  uint *revealed;
  size_t revealedSize;
  int ret;
  picnic_instance_t *in_stack_000000e8;
  uint in_stack_000000f4;
  uint8_t *in_stack_000000f8;
  tree_t *in_stack_00000100;
  int local_34;
  
  local_34 = -1;
  __ptr = getRevealedNodes(unaff_retaddr,in_RDI,in_RSI,in_RDX);
  if (__ptr != (uint *)0x0) {
    expandSeeds(in_stack_00000100,in_stack_000000f8,in_stack_000000f4,in_stack_000000e8);
    local_34 = 0;
  }
  free(__ptr);
  return local_34;
}

Assistant:

int reconstructSeeds(tree_t* tree, uint16_t* hideList, size_t hideListSize, uint8_t* input,
                     size_t inputLen, uint8_t* salt, unsigned int repIndex,
                     const picnic_instance_t* params) {
  int ret                = -1;
  size_t revealedSize    = 0;
  unsigned int* revealed = getRevealedNodes(tree, hideList, hideListSize, &revealedSize);
  if (!revealed || inputLen < revealedSize * params->seed_size) {
    goto Exit;
  }

  for (size_t i = 0; i < revealedSize; i++) {
    memcpy(&tree->nodes[revealed[i] * params->seed_size], input, params->seed_size);
    markNode(tree, revealed[i]);
    input += params->seed_size;
  }

  expandSeeds(tree, salt, repIndex, params);
  ret = 0;

Exit:
  free(revealed);
  return ret;
}